

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O1

void nni_aio_close(nni_aio *aio)

{
  nni_aio_expire_q *mtx;
  nni_aio_cancel_fn UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  
  if ((aio != (nni_aio *)0x0) && (aio->a_init == true)) {
    mtx = aio->a_expire_q;
    nni_mtx_lock(&mtx->eq_mtx);
    nni_list_node_remove(&aio->a_expire_node);
    UNRECOVERED_JUMPTABLE = aio->a_cancel_fn;
    pvVar1 = aio->a_cancel_arg;
    aio->a_cancel_fn = (nni_aio_cancel_fn)0x0;
    aio->a_cancel_arg = (void *)0x0;
    aio->a_stop = true;
    nni_mtx_unlock(&mtx->eq_mtx);
    if (UNRECOVERED_JUMPTABLE != (nni_aio_cancel_fn)0x0) {
      (*UNRECOVERED_JUMPTABLE)(aio,pvVar1,999);
      return;
    }
  }
  return;
}

Assistant:

void
nni_aio_close(nni_aio *aio)
{
	if (aio != NULL && aio->a_init) {
		nni_aio_cancel_fn fn;
		void             *arg;
		nni_aio_expire_q *eq = aio->a_expire_q;

		nni_mtx_lock(&eq->eq_mtx);
		nni_aio_expire_rm(aio);
		fn                = aio->a_cancel_fn;
		arg               = aio->a_cancel_arg;
		aio->a_cancel_fn  = NULL;
		aio->a_cancel_arg = NULL;
		aio->a_stop       = true;
		nni_mtx_unlock(&eq->eq_mtx);

		if (fn != NULL) {
			fn(aio, arg, NNG_ESTOPPED);
		}
	}
}